

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_file_system.cpp
# Opt level: O2

FileSystem * __thiscall
duckdb::VirtualFileSystem::FindFileSystemInternal(VirtualFileSystem *this,string *path)

{
  pointer puVar1;
  int iVar2;
  pointer pFVar3;
  type pFVar4;
  _Head_base<0UL,_duckdb::FileSystem_*,_false> _Var5;
  unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true> *sub_system;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  
  puVar1 = (this->sub_systems).
           super_vector<duckdb::unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  _Var5._M_head_impl = (FileSystem *)0x0;
  for (this_00 = (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(this->sub_systems).
                    super_vector<duckdb::unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      this_00 !=
      (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)puVar1;
      this_00 = (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&(this_00->_M_h)._M_bucket_count) {
    pFVar3 = unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>::
             operator->((unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>
                         *)this_00);
    iVar2 = (*pFVar3->_vptr_FileSystem[0x1f])(pFVar3,path);
    if ((char)iVar2 != '\0') {
      pFVar3 = unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>::
               operator->((unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>
                           *)this_00);
      iVar2 = (*pFVar3->_vptr_FileSystem[0x23])(pFVar3);
      if ((char)iVar2 != '\0') goto LAB_0135ed7c;
      _Var5._M_head_impl =
           (((__uniq_ptr_data<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true,_true>
              *)&(this_00->_M_h)._M_buckets)->
           super___uniq_ptr_impl<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>)._M_t
           .super__Tuple_impl<0UL,_duckdb::FileSystem_*,_std::default_delete<duckdb::FileSystem>_>.
           super__Head_base<0UL,_duckdb::FileSystem_*,_false>._M_head_impl;
    }
  }
  if (_Var5._M_head_impl != (FileSystem *)0x0) {
    return _Var5._M_head_impl;
  }
  this_00 = (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&this->default_fs;
LAB_0135ed7c:
  pFVar4 = unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>::operator*
                     ((unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>
                       *)this_00);
  return pFVar4;
}

Assistant:

FileSystem &VirtualFileSystem::FindFileSystemInternal(const string &path) {
	FileSystem *fs = nullptr;
	for (auto &sub_system : sub_systems) {
		if (sub_system->CanHandleFile(path)) {
			if (sub_system->IsManuallySet()) {
				return *sub_system;
			}
			fs = sub_system.get();
		}
	}
	if (fs) {
		return *fs;
	}
	return *default_fs;
}